

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
      *this)

{
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar1;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3
  ;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_> *pFVar5
  ;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (this->right_->fadexpr_).left_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  return ((((pFVar6->fadexpr_).left_)->val_ + ((pFVar6->fadexpr_).right_)->val_) *
          (pFVar5->fadexpr_).left_.constant_ + ((this->right_->fadexpr_).right_)->val_) *
         ((pFVar2->fadexpr_).left_.constant_ + ((pFVar2->fadexpr_).right_)->val_) *
         ((pFVar4->fadexpr_).left_.constant_ + ((pFVar4->fadexpr_).right_)->val_ +
         ((pFVar3->fadexpr_).right_)->val_) * (pFVar1->fadexpr_).left_.constant_;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}